

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O1

_Bool Curl_conncache_return_conn(connectdata *conn)

{
  Curl_easy *data;
  size_t sVar1;
  connectdata *conn_00;
  connectdata *pcVar2;
  ulong uVar3;
  
  data = conn->data;
  uVar3 = data->multi->maxconnects;
  if ((long)uVar3 < 0) {
    uVar3 = (long)data->multi->num_easy << 2;
  }
  if (uVar3 != 0) {
    sVar1 = Curl_conncache_size(data);
    if (uVar3 < sVar1) {
      Curl_infof(data,"Connection cache is full, closing the oldest one.\n");
      conn_00 = Curl_conncache_extract_oldest(data);
      pcVar2 = (connectdata *)0x0;
      if (conn_00 != (connectdata *)0x0) {
        Curl_disconnect(data,conn_00,false);
        pcVar2 = conn_00;
      }
      goto LAB_0013b8d1;
    }
  }
  pcVar2 = (connectdata *)0x0;
LAB_0013b8d1:
  return pcVar2 != conn;
}

Assistant:

bool Curl_conncache_return_conn(struct connectdata *conn)
{
  struct Curl_easy *data = conn->data;

  /* data->multi->maxconnects can be negative, deal with it. */
  size_t maxconnects =
    (data->multi->maxconnects < 0) ? data->multi->num_easy * 4:
    data->multi->maxconnects;
  struct connectdata *conn_candidate = NULL;

  if(maxconnects > 0 &&
     Curl_conncache_size(data) > maxconnects) {
    infof(data, "Connection cache is full, closing the oldest one.\n");

    conn_candidate = Curl_conncache_extract_oldest(data);
    if(conn_candidate) {
      /* the winner gets the honour of being disconnected */
      (void)Curl_disconnect(data, conn_candidate, /* dead_connection */ FALSE);
    }
  }

  return (conn_candidate == conn) ? FALSE : TRUE;

}